

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_char,_4U>::getUNORM
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<unsigned_char,_4U> *this,uint32_t numChannels,uint32_t targetBits,uint32_t sBits)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint *puVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  int iVar20;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  allocator_type local_39;
  uint local_38;
  uint local_34;
  
  if (4 < numChannels) {
    __assert_fail("numChannels <= componentCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x325,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 4>::getUNORM(uint32_t, uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 4]"
                 );
  }
  if ((0x20 < targetBits) || ((0x100010100U >> ((ulong)targetBits & 0x3f) & 1) == 0)) {
    __assert_fail("targetBits == 8 || targetBits == 16 || targetBits == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x326,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 4>::getUNORM(uint32_t, uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 4]"
                 );
  }
  local_38 = ~(-1 << ((byte)sBits & 0x1f)) << ((char)targetBits - (byte)sBits & 0x1f);
  uVar11 = targetBits >> 3;
  uVar12 = 0;
  local_34 = -(uint)(sBits == 0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,
             (ulong)(uVar11 * numChannels * (this->super_Image).height * (this->super_Image).width),
             &local_39);
  auVar3 = _DAT_0017e500;
  auVar2 = _DAT_0017e4f0;
  uVar5 = (this->super_Image).height;
  if (uVar5 != 0) {
    local_34 = local_34 | local_38;
    uVar7 = (this->super_Image).width;
    uVar4 = 8;
    if (8 < targetBits) {
      uVar4 = (ulong)targetBits;
    }
    uVar4 = uVar4 - 1;
    auVar19._8_4_ = (int)uVar4;
    auVar19._0_8_ = uVar4;
    auVar19._12_4_ = (int)(uVar4 >> 0x20);
    auVar13._0_8_ = uVar4 >> 3;
    auVar13._8_8_ = auVar19._8_8_ >> 3;
    auVar13 = auVar13 ^ _DAT_0017e500;
    uVar9 = uVar7;
    do {
      if (uVar9 == 0) {
        uVar9 = 0;
      }
      else {
        uVar5 = 0;
        do {
          if (numChannels != 0) {
            uVar6 = 0;
            do {
              uVar7 = (this->super_Image).width * uVar12 + uVar5;
              uVar9 = (uint)this->pixels[uVar7].field_0.comps[uVar6];
              if (targetBits == 8) {
                puVar8 = (uint *)((__return_storage_ptr__->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_start +
                                 (uVar7 * numChannels + (int)uVar6) * uVar11);
LAB_0012b870:
                *(byte *)puVar8 = (byte)uVar9 & (byte)local_34;
              }
              else {
                lVar10 = 2;
                auVar14 = ZEXT816(0);
                iVar17 = 0;
                do {
                  auVar19 = auVar14;
                  auVar14._0_8_ = ((ulong)uVar9 << (ulong)(targetBits - iVar17)) >> 8;
                  auVar14._8_8_ = 0;
                  auVar14 = auVar14 | auVar19;
                  iVar17 = iVar17 + 0x10;
                  lVar1 = ((uVar4 >> 3) + 2 & 0xfffffffffffffffe) + lVar10;
                  lVar10 = lVar10 + -2;
                } while (lVar1 != 4);
                lVar10 = -lVar10;
                auVar15._8_4_ = (int)lVar10;
                auVar15._0_8_ = lVar10;
                auVar15._12_4_ = (int)((ulong)lVar10 >> 0x20);
                auVar15 = (auVar15 | auVar2) ^ auVar3;
                iVar17 = -(uint)(auVar13._0_4_ < auVar15._0_4_);
                auVar18._4_4_ = -(uint)(auVar13._4_4_ < auVar15._4_4_);
                iVar20 = -(uint)(auVar13._8_4_ < auVar15._8_4_);
                auVar18._12_4_ = -(uint)(auVar13._12_4_ < auVar15._12_4_);
                auVar21._4_4_ = iVar17;
                auVar21._0_4_ = iVar17;
                auVar21._8_4_ = iVar20;
                auVar21._12_4_ = iVar20;
                auVar16._4_4_ = -(uint)(auVar15._4_4_ == auVar13._4_4_);
                auVar16._12_4_ = -(uint)(auVar15._12_4_ == auVar13._12_4_);
                auVar16._0_4_ = auVar16._4_4_;
                auVar16._8_4_ = auVar16._12_4_;
                auVar18._0_4_ = auVar18._4_4_;
                auVar18._8_4_ = auVar18._12_4_;
                auVar18 = auVar18 | auVar16 & auVar21;
                auVar19 = ~auVar18 & auVar14 | auVar19 & auVar18;
                uVar9 = auVar19._8_4_ | auVar19._0_4_;
                puVar8 = (uint *)((__return_storage_ptr__->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_start +
                                 (uVar7 * numChannels + (int)uVar6) * uVar11);
                if (targetBits == 0x20) {
                  *puVar8 = uVar9 & local_34;
                }
                else if (targetBits == 0x10) {
                  *(ushort *)puVar8 = (ushort)uVar9 & (ushort)local_34;
                }
                else if (targetBits == 8) goto LAB_0012b870;
              }
              uVar6 = uVar6 + 1;
            } while (uVar6 != numChannels);
            uVar7 = (this->super_Image).width;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < uVar7);
        uVar5 = (this->super_Image).height;
        uVar9 = uVar7;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < uVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<uint8_t> getUNORM(uint32_t numChannels, uint32_t targetBits, uint32_t sBits) const override {
        assert(numChannels <= componentCount);
        assert(targetBits == 8 || targetBits == 16 || targetBits == 32);

        const uint32_t sourceBits = sizeof(componentType) * 8;
        const uint32_t targetBytes = targetBits / 8;
        const uint32_t mask = (sBits == 0) ? 0xFFFFFFFF : ((1u << sBits) - 1u) << (targetBits - sBits);
        std::vector<uint8_t> data(height * width * numChannels * targetBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < numChannels; ++c) {
                    const auto sourceValue = c < componentCount ? pixels[y * width + x][c] : (c != 3 ? componentType{0} : Color::one());
                    const auto value = imageio::convertUNORM(static_cast<uint32_t>(sourceValue), sourceBits, targetBits);
                    auto* target = data.data() + (y * width * numChannels + x * numChannels + c) * targetBytes;

                    if (targetBytes == 1) {
                        const auto outValue = static_cast<uint8_t>(value & mask);
                        std::memcpy(target, &outValue, sizeof(outValue));
                    } else if (targetBytes == 2) {
                        const auto outValue = static_cast<uint16_t>(value & mask);
                        std::memcpy(target, &outValue, sizeof(outValue));
                    } else if (targetBytes == 4) {
                        const auto outValue = static_cast<uint32_t>(value & mask);
                        std::memcpy(target, &outValue, sizeof(outValue));
                    }
                }
            }
        }

        return data;
    }